

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkTriggerDelete(sqlite3 *dbMem,Trigger *p)

{
  TriggerStep *pTVar1;
  TriggerStep *pStep;
  Trigger *p_local;
  sqlite3 *dbMem_local;
  
  if (p != (Trigger *)0x0) {
    pTVar1 = p->step_list;
    sqlite3ExprDelete(dbMem,pTVar1->pWhere);
    sqlite3ExprListDelete(dbMem,pTVar1->pExprList);
    sqlite3SelectDelete(dbMem,pTVar1->pSelect);
    sqlite3ExprDelete(dbMem,p->pWhen);
    sqlite3DbFree(dbMem,p);
  }
  return;
}

Assistant:

static void fkTriggerDelete(sqlite3 *dbMem, Trigger *p){
  if( p ){
    TriggerStep *pStep = p->step_list;
    sqlite3ExprDelete(dbMem, pStep->pWhere);
    sqlite3ExprListDelete(dbMem, pStep->pExprList);
    sqlite3SelectDelete(dbMem, pStep->pSelect);
    sqlite3ExprDelete(dbMem, p->pWhen);
    sqlite3DbFree(dbMem, p);
  }
}